

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O0

void __thiscall FootprintToBin::ReadFootprintFileNoChecks(FootprintToBin *this)

{
  int iVar1;
  char *pcVar2;
  FootprintToBin *this_local;
  
  ReadFirstFootprintLine(this);
  (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[1])();
  while( true ) {
    pcVar2 = fgets((this->super_ValidateFootprint).super_Validate.line_,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) break;
    iVar1 = ValidateFootprint::ScanLine(&this->super_ValidateFootprint);
    if (iVar1 == 4) {
      (this->super_ValidateFootprint).fr_.event_id =
           (int)(this->super_ValidateFootprint).initialEveID_;
      (this->super_ValidateFootprint).fr_.super_EventRow.areaperil_id =
           (AREAPERIL_INT)(this->super_ValidateFootprint).initialAreaperilID_;
      if ((this->super_ValidateFootprint).fr_.event_id !=
          (this->super_ValidateFootprint).prevEventID_) {
        (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[2])();
        (**(this->super_ValidateFootprint)._vptr_ValidateFootprint)();
      }
      (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[1])();
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_ValidateFootprint).super_Validate.lineno_,
              &(this->super_ValidateFootprint).super_Validate);
      Validate::PrintErrorMessage(&(this->super_ValidateFootprint).super_Validate);
    }
  }
  (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[2])();
  return;
}

Assistant:

void FootprintToBin::ReadFootprintFileNoChecks() {
/* If user is satisfied that the footprint csv file is sound and therefore does
 * not require any validation checks, this method can be executed instead of
 * ValidateFootprint::ReadFootprintFile(). This method assumes that the methods
 * Validate:SkipHeaderRow() and WriteHeader() have been executed beforehand. */

  ReadFirstFootprintLine();
  WriteBinFootprintFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = (int)initialEveID_;
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = (unsigned int)initialAreaperilID_;
#endif

      if (fr_.event_id != prevEventID_) {

        WriteIdxFootprintFile();
	SetPreviousEventID();

      }

      WriteBinFootprintFile();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  WriteIdxFootprintFile();

}